

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O0

bool __thiscall
Rml::DecoratorNinePatch::Initialise
          (DecoratorNinePatch *this,Rectanglef *_rect_outer,Rectanglef *_rect_inner,
          Array<NumericValue,_4> *_edges,Texture _texture,float _display_scale)

{
  Texture texture;
  int iVar1;
  int texture_index;
  float local_3c;
  NumericValue NStack_38;
  float _display_scale_local;
  Array<NumericValue,_4> *_edges_local;
  Rectanglef *_rect_inner_local;
  Rectanglef *_rect_outer_local;
  DecoratorNinePatch *this_local;
  Texture _texture_local;
  
  _texture_local.render_manager = _texture._8_8_;
  this_local = (DecoratorNinePatch *)_texture.render_manager;
  (this->rect_outer).p0 = _rect_outer->p0;
  (this->rect_outer).p1 = _rect_outer->p1;
  (this->rect_inner).p0 = _rect_inner->p0;
  (this->rect_inner).p1 = _rect_inner->p1;
  this->display_scale = _display_scale;
  local_3c = _display_scale;
  NStack_38 = (NumericValue)_edges;
  _edges_local = (Array<NumericValue,_4> *)_rect_inner;
  _rect_inner_local = _rect_outer;
  _rect_outer_local = (Rectanglef *)this;
  if (_edges != (Array<NumericValue,_4> *)0x0) {
    MakeUnique<std::array<Rml::NumericValue,4ul>,std::array<Rml::NumericValue,4ul>const&>
              ((array<Rml::NumericValue,_4UL> *)&stack0xffffffffffffffb8);
    ::std::
    unique_ptr<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
    ::operator=(&this->edges,
                (unique_ptr<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                 *)&stack0xffffffffffffffb8);
    ::std::
    unique_ptr<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
    ::~unique_ptr((unique_ptr<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                   *)&stack0xffffffffffffffb8);
  }
  texture._8_8_ = _texture_local.render_manager;
  texture.render_manager = (RenderManager *)this_local;
  iVar1 = Decorator::AddTexture(&this->super_Decorator,texture);
  return -1 < iVar1;
}

Assistant:

bool DecoratorNinePatch::Initialise(const Rectanglef& _rect_outer, const Rectanglef& _rect_inner, const Array<NumericValue, 4>* _edges,
	Texture _texture, float _display_scale)
{
	rect_outer = _rect_outer;
	rect_inner = _rect_inner;

	display_scale = _display_scale;

	if (_edges)
		edges = MakeUnique<Array<NumericValue, 4>>(*_edges);

	int texture_index = AddTexture(_texture);
	return (texture_index >= 0);
}